

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O1

NFRule * __thiscall icu_63::NFRuleSet::findNormalRule(NFRuleSet *this,int64_t number)

{
  NFRule **ppNVar1;
  int64_t *piVar2;
  int64_t *piVar3;
  uint uVar4;
  UBool UVar5;
  NFRule *pNVar6;
  uint uVar7;
  int iVar8;
  NFRule *unaff_R14;
  uint uVar9;
  
  if (this->fIsFractionRuleSet != '\0') {
    pNVar6 = findFractionRuleSetRule(this,(double)number);
    return pNVar6;
  }
  if (number < 0) {
    if (this->nonNumericalRules[0] != (NFRule *)0x0) {
      return this->nonNumericalRules[0];
    }
    number = -number;
    unaff_R14 = (NFRule *)0x0;
  }
  uVar9 = (this->rules).fCount;
  if ((int)uVar9 < 1) {
    pNVar6 = this->nonNumericalRules[3];
  }
  else {
    iVar8 = 0;
    do {
      if ((int)uVar9 <= iVar8) {
        if (uVar9 != 0) {
          pNVar6 = (this->rules).fStuff[uVar9 - 1];
          UVar5 = NFRule::shouldRollBack(pNVar6,number);
          if (UVar5 == '\0') {
            return pNVar6;
          }
          if ((uVar9 != 1) && (ppNVar1 = (this->rules).fStuff, ppNVar1 != (NFRule **)0x0)) {
            return ppNVar1[uVar9 - 2];
          }
        }
        return (NFRule *)0x0;
      }
      uVar7 = iVar8 + uVar9 >> 1;
      pNVar6 = (this->rules).fStuff[uVar7];
      piVar2 = &pNVar6->baseValue;
      uVar4 = uVar9;
      if ((*piVar2 != number) &&
         (piVar3 = &pNVar6->baseValue, pNVar6 = unaff_R14, uVar4 = uVar7, *piVar3 <= number)) {
        iVar8 = uVar7 + 1;
        uVar4 = uVar9;
      }
      uVar9 = uVar4;
      unaff_R14 = pNVar6;
    } while (*piVar2 != number);
  }
  return pNVar6;
}

Assistant:

const NFRule *
NFRuleSet::findNormalRule(int64_t number) const
{
    // if this is a fraction rule set, use findFractionRuleSetRule()
    // to find the rule (we should only go into this clause if the
    // value is 0)
    if (fIsFractionRuleSet) {
        return findFractionRuleSetRule((double)number);
    }

    // if the number is negative, return the negative-number rule
    // (if there isn't one, pretend the number is positive)
    if (number < 0) {
        if (nonNumericalRules[NEGATIVE_RULE_INDEX]) {
            return nonNumericalRules[NEGATIVE_RULE_INDEX];
        } else {
            number = -number;
        }
    }

    // we have to repeat the preceding two checks, even though we
    // do them in findRule(), because the version of format() that
    // takes a long bypasses findRule() and goes straight to this
    // function.  This function does skip the fraction rules since
    // we know the value is an integer (it also skips the master
    // rule, since it's considered a fraction rule.  Skipping the
    // master rule in this function is also how we avoid infinite
    // recursion)

    // {dlf} unfortunately this fails if there are no rules except
    // special rules.  If there are no rules, use the master rule.

    // binary-search the rule list for the applicable rule
    // (a rule is used for all values from its base value to
    // the next rule's base value)
    int32_t hi = rules.size();
    if (hi > 0) {
        int32_t lo = 0;

        while (lo < hi) {
            int32_t mid = (lo + hi) / 2;
            if (rules[mid]->getBaseValue() == number) {
                return rules[mid];
            }
            else if (rules[mid]->getBaseValue() > number) {
                hi = mid;
            }
            else {
                lo = mid + 1;
            }
        }
        if (hi == 0) { // bad rule set, minimum base > 0
            return NULL; // want to throw exception here
        }

        NFRule *result = rules[hi - 1];

        // use shouldRollBack() to see whether we need to invoke the
        // rollback rule (see shouldRollBack()'s documentation for
        // an explanation of the rollback rule).  If we do, roll back
        // one rule and return that one instead of the one we'd normally
        // return
        if (result->shouldRollBack(number)) {
            if (hi == 1) { // bad rule set, no prior rule to rollback to from this base
                return NULL;
            }
            result = rules[hi - 2];
        }
        return result;
    }
    // else use the master rule
    return nonNumericalRules[MASTER_RULE_INDEX];
}